

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall UnitTestBasehello11::Run(UnitTestBasehello11 *this)

{
  bool bVar1;
  UnitTestBase *pUVar2;
  allocator local_ed;
  allocator local_ec;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Regex t;
  
  bert::Regex::Regex(&t,"[^abc]*");
  bVar1 = bert::Regex::Match(&t,"xyz");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_68,"\'t.Match(\"xyz\")\'",&local_e9);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,true,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"\'t.Match(\"xyz\")\'",&local_e9);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,false,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = bert::Regex::Match(&t,"a");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_88,"\'!(t.Match(\"a\"))\'",&local_ea);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,false,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_88,"\'!(t.Match(\"a\"))\'",&local_ea);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,true,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = bert::Regex::Match(&t,"b");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_a8,"\'!(t.Match(\"b\"))\'",&local_eb);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,false,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"\'!(t.Match(\"b\"))\'",&local_eb);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,true,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = bert::Regex::Match(&t,"abc");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_c8,"\'!(t.Match(\"abc\"))\'",&local_ec);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,false,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_c8,"\'!(t.Match(\"abc\"))\'",&local_ec);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,true,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  bVar1 = bert::Regex::Match(&t,"fuckabc");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_e8,"\'!(t.Match(\"fuckabc\"))\'",&local_ed);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_e8,false,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,"\'!(t.Match(\"fuckabc\"))\'",&local_ed);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_e8,true,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_e8);
  bert::Regex::~Regex(&t);
  return;
}

Assistant:

TEST_CASE(hello11)
{
    Regex t("[^abc]*");
    EXPECT_TRUE(t.Match("xyz"));
    EXPECT_FALSE(t.Match("a"));
    EXPECT_FALSE(t.Match("b"));
    EXPECT_FALSE(t.Match("abc"));
    EXPECT_FALSE(t.Match("fuckabc"));
}